

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *this,
          uint *key,ExternFuncInfo **value)

{
  uint uVar1;
  Node *pNVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<unsigned int, ExternFuncInfo *, SmallDenseMapUnsignedHasher, 32>::insert(const Key &, const Value &) [Key = unsigned int, Value = ExternFuncInfo *, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                 );
  }
  uVar5 = this->bucketCount;
  if (uVar5 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar5 = this->bucketCount;
    if (uVar5 == 0) goto LAB_001caa40;
  }
  uVar1 = uVar5 - 1;
  uVar3 = *key;
  uVar6 = uVar3 * -0x61c88647;
  iVar7 = 0;
  do {
    uVar6 = uVar6 & uVar1;
    pNVar2 = this->data + uVar6;
    uVar4 = this->data[uVar6].key;
    if (uVar4 == 0) {
      pNVar2->key = uVar3;
      pNVar2->value = *value;
      this->count = this->count + 1;
      return;
    }
    if (uVar4 == uVar3) {
      pNVar2->value = *value;
      return;
    }
    uVar6 = uVar6 + iVar7 + 1;
    iVar7 = iVar7 + 1;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
LAB_001caa40:
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<unsigned int, ExternFuncInfo *, SmallDenseMapUnsignedHasher, 32>::insert(const Key &, const Value &) [Key = unsigned int, Value = ExternFuncInfo *, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}